

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O3

int64_t __thiscall
SharedMemRingBuffer::ClaimIndex
          (SharedMemRingBuffer *this,size_t want_len,size_t *out_position_to_write)

{
  atomic<long> *paVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  pointer pp_Var5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ENUM_DATA_STATUS EVar12;
  
  if (this->max_data_size_ < want_len) {
    return -1;
  }
  LOCK();
  paVar1 = &this->ring_buffer_status_on_shared_mem_->next;
  uVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  uVar11 = uVar2 + 1;
  (this->ring_buffer_).buffer_.
  super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
  super__Vector_impl_data._M_start[(this->ring_buffer_).capacity_ - 1 & uVar11]->status = DATA_EMPTY
  ;
  sVar3 = this->buffer_size_;
  EVar12 = DATA_EMPTY;
  do {
    if (-1 < (long)uVar2) {
      EVar12 = (this->ring_buffer_).buffer_.
               super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
               super__Vector_impl_data._M_start
               [(this->ring_buffer_).capacity_ + 0x7fffffffffffffff & uVar2]->status;
    }
    if ((this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
        super___atomic_base<int>._M_i < 1) {
      lVar9 = 0;
    }
    else {
      lVar10 = 0;
      lVar9 = 0x7fffffffffffffff;
      bVar8 = 0;
      do {
        bVar7 = bVar8;
        lVar4 = this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[lVar10].
                super___atomic_base<long>._M_i;
        bVar6 = lVar4 < lVar9;
        if (lVar4 < lVar9) {
          lVar9 = lVar4;
        }
        lVar10 = lVar10 + 1;
        bVar8 = bVar7 | bVar6;
      } while (lVar10 < (this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
                        super___atomic_base<int>._M_i);
      if (!(bool)(bVar7 | bVar6)) {
        lVar9 = 0;
      }
    }
    if (((long)(uVar11 - sVar3) < lVar9) && ((long)uVar2 < 0 || EVar12 != DATA_EMPTY)) {
      if (uVar11 == 0) {
        uVar11 = 0;
        goto LAB_001040e2;
      }
      pp_Var5 = (this->ring_buffer_).buffer_.
                super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
                super__Vector_impl_data._M_start;
      *out_position_to_write = pp_Var5[(this->ring_buffer_).capacity_ - 1 & uVar2]->offset_position;
      if ((long)uVar2 < 0) {
        return uVar11;
      }
      if (pp_Var5[(this->ring_buffer_).capacity_ + 0x7fffffffffffffff & uVar2]->offset_position +
          want_len <= this->raw_mem_buffer_capacity_) {
        return uVar11;
      }
      if ((lVar9 == 0) ||
         ((this->ring_buffer_status_on_shared_mem_->prev_reset_pos).super___atomic_base<long>._M_i
          <= lVar9)) {
        LOCK();
        (this->ring_buffer_status_on_shared_mem_->prev_reset_pos).super___atomic_base<long>._M_i =
             uVar11;
        UNLOCK();
LAB_001040e2:
        *out_position_to_write = 0;
        return uVar11;
      }
    }
    sched_yield();
  } while( true );
}

Assistant:

int64_t SharedMemRingBuffer::ClaimIndex(size_t want_len, size_t * out_position_to_write )
{
    if( want_len > max_data_size_ ) {
        DEBUG_ELOG("Error: Invalid data length : exceeds MAX : " << max_data_size_); 
        return -1;
    }
    ENUM_DATA_STATUS data_status = DATA_EMPTY;
    int64_t next_seq_for_claim = GetNextSequenceForClaim() ;
    ring_buffer_[next_seq_for_claim]->status =DATA_EMPTY; //init
    //다음 쓰기 위치 - 링버퍼 크기 = 링버퍼 한번 순회 이전위치, 
    //데이터 쓰기 작업이 링버퍼를 완전히 한바퀴 순회한 경우
    //여기서 더 진행하면 데이터를 이전 덮어쓰게 된다.
    //만약 아직 데이터를 read하지 못한 상태
    //(min customer index가 wrap position보다 작거나 같은 경우)라면 쓰기 작업은 대기해야 한다
    int64_t wrap_point = next_seq_for_claim - buffer_size_;

    do {
        if(next_seq_for_claim>0) {
            data_status = ring_buffer_[next_seq_for_claim-1]->status ;
        }

        int64_t gating_seq = GetMinIndexOfConsumers();
        if  ( wrap_point >=  gating_seq ) {
            std::this_thread::yield();
            continue;
        } else if  ( next_seq_for_claim>0 && data_status == DATA_EMPTY ) {
            //because of arbitrary data length, we need to wait until previous data is set 

            std::this_thread::yield();
            DEBUG_LOG("continue , DATA_EMPTY / next_seq_for_claim:" << next_seq_for_claim); 
            continue;
        } else {
            //calculate out_position_to_write
            if(next_seq_for_claim==0) {
                *out_position_to_write = 0;
            } else {
                *out_position_to_write = ring_buffer_[next_seq_for_claim-1]->offset_position ;
                DEBUG_LOG("write pos: "<< *out_position_to_write); 
            }

            if( next_seq_for_claim>0 && 
                ring_buffer_[next_seq_for_claim-1]->offset_position + want_len > raw_mem_buffer_capacity_ ) {
                //last write position + wanted data length > total data buffer size 
                //--> start from 0 position  
                DEBUG_LOG( "prev_reset_pos : "<< ring_buffer_status_on_shared_mem_->prev_reset_pos); 
                if( gating_seq!=0 && 
                    gating_seq < ring_buffer_status_on_shared_mem_->prev_reset_pos ) {
                    //but don't over-write customer data 
                    //'gating_seq == 0' means a consumer read index 0, so it is OK to write at index 0
                    
                    std::this_thread::yield();
                    DEBUG_LOG( "spin... / gating_seq=" << gating_seq
                          << " / next_seq_for_claim= "<< next_seq_for_claim 
                          << " / ring_buffer_status_on_shared_mem_->prev_reset_pos=" 
                          << ring_buffer_status_on_shared_mem_->prev_reset_pos ); 
                    continue;
                }
                ring_buffer_status_on_shared_mem_->prev_reset_pos = next_seq_for_claim ;
                DEBUG_LOG("raw_mem_buffer_capacity_ :"<< raw_mem_buffer_capacity_ 
                          << " / gating_seq: "<< gating_seq << " / want_len:"
                          << want_len <<" / ring_buffer_[gating_seq]->start_position: "
                          << ring_buffer_[gating_seq]->start_position );
                DEBUG_LOG( "reset pos 0 "); 
                *out_position_to_write = 0;
            }
            break;
        }
    } while (true);

    DEBUG_LOG("RETURN next_seq_for_claim:" << next_seq_for_claim ); 
    return next_seq_for_claim;
}